

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadedSocketAcceptor.cpp
# Opt level: O2

void __thiscall
FIX::ThreadedSocketAcceptor::removeThread(ThreadedSocketAcceptor *this,socket_handle s)

{
  iterator __position;
  key_type local_24;
  
  Mutex::lock(&this->m_mutex);
  __position = std::
               _Rb_tree<int,_std::pair<const_int,_unsigned_long>,_std::_Select1st<std::pair<const_int,_unsigned_long>_>,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
               ::find(&(this->m_threads)._M_t,&local_24);
  if ((_Rb_tree_header *)__position._M_node != &(this->m_threads)._M_t._M_impl.super__Rb_tree_header
     ) {
    thread_detach((thread_id)__position._M_node[1]._M_parent);
    std::
    _Rb_tree<int,std::pair<int_const,unsigned_long>,std::_Select1st<std::pair<int_const,unsigned_long>>,std::less<int>,std::allocator<std::pair<int_const,unsigned_long>>>
    ::erase_abi_cxx11_((_Rb_tree<int,std::pair<int_const,unsigned_long>,std::_Select1st<std::pair<int_const,unsigned_long>>,std::less<int>,std::allocator<std::pair<int_const,unsigned_long>>>
                        *)&this->m_threads,__position);
  }
  Mutex::unlock(&this->m_mutex);
  return;
}

Assistant:

void ThreadedSocketAcceptor::removeThread(socket_handle s) {
  Locker l(m_mutex);
  SocketToThread::iterator i = m_threads.find(s);
  if (i != m_threads.end()) {
    thread_detach(i->second);
    m_threads.erase(i);
  }
}